

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::String::String(String *this,char *in,uint in_size)

{
  char *pcVar1;
  uint in_EDX;
  void *in_RSI;
  String *in_RDI;
  
  if (in_EDX < 0x18) {
    memcpy(in_RDI,in_RSI,(ulong)in_EDX);
    (in_RDI->field_0).buf[in_EDX] = '\0';
    setLast(in_RDI,0x17 - in_EDX);
  }
  else {
    setOnHeap(in_RDI);
    (in_RDI->field_0).data.size = in_EDX;
    (in_RDI->field_0).data.capacity = (in_RDI->field_0).data.size + 1;
    pcVar1 = (char *)operator_new__((ulong)(in_RDI->field_0).data.capacity);
    (in_RDI->field_0).data.ptr = pcVar1;
    memcpy((in_RDI->field_0).data.ptr,in_RSI,(ulong)in_EDX);
    (in_RDI->field_0).data.ptr[in_EDX] = '\0';
  }
  return;
}

Assistant:

String::String(const char* in, unsigned in_size) {
    using namespace std;
    if(in_size <= last) {
        memcpy(buf, in, in_size);
        buf[in_size] = '\0';
        setLast(last - in_size);
    } else {
        setOnHeap();
        data.size     = in_size;
        data.capacity = data.size + 1;
        data.ptr      = new char[data.capacity];
        memcpy(data.ptr, in, in_size);
        data.ptr[in_size] = '\0';
    }
}